

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>::
ContIntFromDescriptor
          (ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
           *this,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  Scalar *pSVar2;
  
  SVar1 = (this->Nx).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,(ulong)off_L);
  *pSVar2 = SVar1;
  SVar1 = (this->Tu).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                      (ulong)(off_L + 1));
  *pSVar2 = SVar1;
  SVar1 = (this->Tv).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                      (ulong)(off_L + 2));
  *pSVar2 = SVar1;
  return;
}

Assistant:

virtual void ContIntFromDescriptor(const unsigned int off_L,
                                       ChVectorDynamic<>& L
                                       ) override {
        L(off_L) = Nx.Get_l_i();
        L(off_L + 1) = Tu.Get_l_i();
        L(off_L + 2) = Tv.Get_l_i();
    }